

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void Terminate(PaUtilHostApiRepresentation *hostApi)

{
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaUtilHostApiRepresentation *hostApi_local;
  
  if (hostApi != (PaUtilHostApiRepresentation *)0x0) {
    if (hostApi[3].Terminate != (_func_void_PaUtilHostApiRepresentation_ptr *)0x0) {
      PaUtil_FreeAllAllocations((PaUtilAllocationGroup *)hostApi[3].Terminate);
      PaUtil_DestroyAllocationGroup((PaUtilAllocationGroup *)hostApi[3].Terminate);
    }
    PaUtil_FreeMemory(hostApi);
    (*(code *)alsa_snd_config_update_free_global)();
    PaAlsa_CloseLibrary();
    return;
  }
  __assert_fail("hostApi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                ,0x329,"void Terminate(struct PaUtilHostApiRepresentation *)");
}

Assistant:

static void Terminate( struct PaUtilHostApiRepresentation *hostApi )
{
    PaAlsaHostApiRepresentation *alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;

    assert( hostApi );

    /** See AlsaErrorHandler and PaAlsa_Initialize for details.
    */
    /*snd_lib_error_set_handler(NULL);*/

    if( alsaHostApi->allocations )
    {
        PaUtil_FreeAllAllocations( alsaHostApi->allocations );
        PaUtil_DestroyAllocationGroup( alsaHostApi->allocations );
    }

    PaUtil_FreeMemory( alsaHostApi );
    alsa_snd_config_update_free_global();

    /* Close Alsa library. */
    PaAlsa_CloseLibrary();
}